

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  Layer *pLVar2;
  bool bVar3;
  float *pfVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar5;
  float max;
  float min;
  float slope;
  float w_1;
  float val;
  int k;
  float *sptr;
  Mat m;
  int q;
  float *kptr;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat weights [4];
  ParamDict pd;
  Layer *op;
  int num_input;
  Mat *in_stack_fffffffffffff2e8;
  undefined4 in_stack_fffffffffffff2f0;
  float in_stack_fffffffffffff2f4;
  Mat *in_stack_fffffffffffff2f8;
  allocator_type *in_stack_fffffffffffff300;
  int in_stack_fffffffffffff308;
  int in_stack_fffffffffffff30c;
  Mat *in_stack_fffffffffffff310;
  ParamDict *in_stack_fffffffffffff330;
  Mat *local_c70;
  Option *in_stack_fffffffffffff3b8;
  Mat *this_00;
  Mat *in_stack_fffffffffffff3c0;
  Mat *in_stack_fffffffffffff3c8;
  Mat *pMVar6;
  Convolution *in_stack_fffffffffffff3d0;
  float local_c08;
  float local_c04;
  float local_c00;
  int local_bfc;
  float *local_bf8;
  Mat local_bf0;
  int local_bac;
  float *local_ba8;
  float local_b9c;
  int local_b98;
  int local_b94;
  Mat local_b90;
  float *local_b50;
  int local_b48;
  int local_b44;
  int local_b40;
  int local_b3c;
  int local_b38;
  int local_b34;
  reference local_b30;
  vector<int,_std::allocator<int>_> local_b20;
  int local_b08;
  int local_b04;
  int local_b00;
  undefined4 local_afc;
  Mat local_af8;
  int local_ab8;
  int local_ab4;
  undefined8 local_ab0;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  undefined1 local_a98 [40];
  Option *in_stack_fffffffffffff590;
  Mat *in_stack_fffffffffffff598;
  Mat *in_stack_fffffffffffff5a0;
  Convolution *in_stack_fffffffffffff5a8;
  Mat local_a48 [4];
  undefined1 auStack_948 [2320];
  Layer *local_38;
  int local_2c;
  long local_28;
  undefined8 local_20;
  long local_18;
  int local_4;
  
  if (((*(byte *)(in_RCX + 0x1a) & 1) == 0) || (*(long *)(in_RDI + 0x148) != 1)) {
    if ((*(int *)(in_RSI + 0x28) == 1) &&
       (((*(int *)(in_RDI + 0xbc) == 1 && (*(int *)(in_RDI + 0xc0) == 1)) &&
        (local_2c = *(int *)(in_RDI + 0xec) / *(int *)(in_RDI + 0xb8),
        *(int *)(in_RSI + 0x2c) == local_2c)))) {
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_38 = create_layer((int)((ulong)in_stack_fffffffffffff2f8 >> 0x20));
      ParamDict::ParamDict(in_stack_fffffffffffff330);
      ParamDict::set((ParamDict *)(auStack_948 + 0x10),0,*(int *)(in_RDI + 0xb8));
      ParamDict::set((ParamDict *)(auStack_948 + 0x10),1,*(int *)(in_RDI + 0xe8));
      ParamDict::set((ParamDict *)(auStack_948 + 0x10),2,*(int *)(in_RDI + 0xec));
      ParamDict::set((ParamDict *)(auStack_948 + 0x10),8,*(int *)(in_RDI + 0xf0));
      (*local_38->_vptr_Layer[2])(local_38,auStack_948 + 0x10);
      this_00 = local_a48;
      pMVar6 = (Mat *)auStack_948;
      do {
        Mat::Mat(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pMVar6);
      Mat::operator=(in_stack_fffffffffffff2f8,
                     (Mat *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
      Mat::operator=(in_stack_fffffffffffff2f8,
                     (Mat *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
      if (*(int *)(in_RDI + 0xf0) != 0) {
        Mat::operator=(in_stack_fffffffffffff2f8,
                       (Mat *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
        Mat::Mat((Mat *)(local_a98 + 0x10),1,4,(void *)(in_RDI + 0x1f8),4,(Allocator *)0x0);
        Mat::operator=(in_stack_fffffffffffff2f8,
                       (Mat *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
        Mat::~Mat((Mat *)0x134767);
      }
      pLVar2 = local_38;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                 in_stack_fffffffffffff2e8);
      (*pLVar2->_vptr_Layer[3])(pLVar2,local_a98);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x13487d);
      (*local_38->_vptr_Layer[4])(local_38,local_28);
      (*local_38->_vptr_Layer[7])(local_38,local_18,local_20,local_28);
      if (local_38 != (Layer *)0x0) {
        (*local_38->_vptr_Layer[1])();
      }
      local_4 = 0;
      local_c70 = (Mat *)auStack_948;
      do {
        local_c70 = local_c70 + -1;
        Mat::~Mat((Mat *)0x13494e);
      } while (local_c70 != local_a48);
      ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff300);
    }
    else {
      local_a9c = *(int *)(in_RSI + 0x2c);
      local_aa0 = *(int *)(in_RSI + 0x30);
      local_aa4 = *(int *)(in_RSI + 0x34);
      local_ab0 = *(undefined8 *)(in_RSI + 0x10);
      local_ab4 = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
      local_ab8 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
      Mat::Mat(&local_af8);
      make_padding(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                   in_stack_fffffffffffff3b8);
      bVar3 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
      if (bVar3) {
        local_4 = -100;
        local_afc = 1;
      }
      else {
        local_a9c = local_af8.w;
        local_aa0 = local_af8.h;
        local_b00 = (local_af8.w - local_ab4) / *(int *)(in_RDI + 0xcc) + 1;
        local_b04 = (local_af8.h - local_ab8) / *(int *)(in_RDI + 0xd0) + 1;
        local_b08 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
        std::allocator<int>::allocator((allocator<int> *)0x134b91);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff310,
                   CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                   in_stack_fffffffffffff300);
        std::allocator<int>::~allocator((allocator<int> *)0x134bb7);
        local_b30 = std::vector<int,_std::allocator<int>_>::operator[](&local_b20,0);
        local_b34 = 0;
        local_b38 = 0;
        local_b3c = local_a9c * *(int *)(in_RDI + 200) -
                    *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc4);
        for (local_b40 = 0; local_b40 < *(int *)(in_RDI + 0xc0); local_b40 = local_b40 + 1) {
          for (local_b44 = 0; local_b44 < *(int *)(in_RDI + 0xbc); local_b44 = local_b44 + 1) {
            local_b30[local_b34] = local_b38;
            local_b34 = local_b34 + 1;
            local_b38 = *(int *)(in_RDI + 0xc4) + local_b38;
          }
          local_b38 = local_b3c + local_b38;
        }
        Mat::create(in_stack_fffffffffffff310,in_stack_fffffffffffff30c,in_stack_fffffffffffff308,
                    (int)((ulong)in_stack_fffffffffffff300 >> 0x20),
                    (size_t)in_stack_fffffffffffff2f8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
        bVar3 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
        if (bVar3) {
          local_4 = -100;
        }
        else {
          for (local_b48 = 0; local_b48 < *(int *)(in_RDI + 0xb8); local_b48 = local_b48 + 1) {
            Mat::channel(in_stack_fffffffffffff2f8,(int)in_stack_fffffffffffff2f4);
            pfVar4 = Mat::operator_cast_to_float_(&local_b90);
            Mat::~Mat((Mat *)0x134dfe);
            local_b50 = pfVar4;
            for (local_b94 = 0; local_b94 < local_b04; local_b94 = local_b94 + 1) {
              for (local_b98 = 0; local_b98 < local_b00; local_b98 = local_b98 + 1) {
                local_b9c = 0.0;
                if (*(int *)(in_RDI + 0xe8) != 0) {
                  pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_b48);
                  local_b9c = *pfVar4;
                }
                local_ba8 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x138));
                local_ba8 = local_ba8 + local_b08 * local_aa4 * local_b48;
                for (local_bac = 0; local_bac < local_aa4; local_bac = local_bac + 1) {
                  Mat::channel(in_stack_fffffffffffff2f8,(int)in_stack_fffffffffffff2f4);
                  local_bf8 = Mat::row(&local_bf0,local_b94 * *(int *)(in_RDI + 0xd0));
                  local_bf8 = local_bf8 + local_b98 * *(int *)(in_RDI + 0xcc);
                  for (local_bfc = 0; local_bfc < local_b08; local_bfc = local_bfc + 1) {
                    local_c00 = local_bf8[local_b30[local_bfc]];
                    local_c04 = local_ba8[local_bfc];
                    local_b9c = local_c00 * local_c04 + local_b9c;
                  }
                  local_ba8 = local_ba8 + local_b08;
                  Mat::~Mat((Mat *)0x135097);
                }
                if (*(int *)(in_RDI + 0xf4) == 1) {
                  local_c08 = 0.0;
                  pfVar4 = std::max<float>(&local_b9c,&local_c08);
                  local_b9c = *pfVar4;
                }
                else if (*(int *)(in_RDI + 0xf4) == 2) {
                  pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xf8),0);
                  if (local_b9c <= 0.0) {
                    local_b9c = local_b9c * *pfVar4;
                  }
                }
                else if (*(int *)(in_RDI + 0xf4) == 3) {
                  in_stack_fffffffffffff300 =
                       (allocator_type *)Mat::operator[]((Mat *)(in_RDI + 0xf8),0);
                  fVar1 = *(float *)in_stack_fffffffffffff300;
                  in_stack_fffffffffffff2f8 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0xf8),1);
                  if (local_b9c < fVar1) {
                    local_b9c = fVar1;
                  }
                  if (*(float *)&in_stack_fffffffffffff2f8->data < local_b9c) {
                    local_b9c = *(float *)&in_stack_fffffffffffff2f8->data;
                  }
                }
                else if (*(int *)(in_RDI + 0xf4) == 4) {
                  dVar5 = std::exp((double)((ulong)(uint)local_b9c ^ 0x8000000080000000));
                  in_stack_fffffffffffff2f4 = SUB84(dVar5,0);
                  local_b9c = 1.0 / (in_stack_fffffffffffff2f4 + 1.0);
                }
                local_b50[local_b98] = local_b9c;
              }
              local_b50 = local_b50 + local_b00;
            }
          }
          local_4 = 0;
        }
        local_afc = 1;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff300);
      }
      Mat::~Mat((Mat *)0x135377);
    }
  }
  else {
    local_4 = forward_int8(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                           in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  }
  return local_4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}